

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::CategoricalDistributionLayerParams::MergePartialFromCodedStream
          (CategoricalDistributionLayerParams *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  float *pfVar3;
  uint8 *puVar4;
  bool bVar5;
  uint32 uVar6;
  undefined8 in_RAX;
  unsigned_long uVar7;
  char cVar8;
  ulong uVar9;
  float fVar10;
  pair<unsigned_long,_bool> pVar11;
  undefined8 local_38;
  
  local_38 = in_RAX;
LAB_003ba124:
  do {
    pbVar2 = input->buffer_;
    uVar6 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar6 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003ba147;
      input->buffer_ = pbVar2 + 1;
      uVar9 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003ba147:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar9 = 0;
      if (uVar6 - 1 < 0x7f) {
        uVar9 = 0x100000000;
      }
      uVar9 = uVar6 | uVar9;
    }
    uVar6 = (uint32)uVar9;
    if ((uVar9 & 0x100000000) != 0) {
      cVar8 = (char)uVar9;
      switch((uint)(uVar9 >> 3) & 0x1fffffff) {
      case 1:
        if (cVar8 == '\b') {
          puVar4 = input->buffer_;
          if ((puVar4 < input->buffer_end_) &&
             (uVar7 = (unsigned_long)(char)*puVar4, -1 < (long)uVar7)) {
            input->buffer_ = puVar4 + 1;
          }
          else {
            pVar11 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
            uVar7 = pVar11.first;
            if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              return false;
            }
          }
          this->seed_ = uVar7;
          goto LAB_003ba124;
        }
        break;
      case 2:
        if (cVar8 == '\x10') {
          puVar4 = input->buffer_;
          if ((puVar4 < input->buffer_end_) &&
             (uVar7 = (unsigned_long)(char)*puVar4, -1 < (long)uVar7)) {
            input->buffer_ = puVar4 + 1;
          }
          else {
            pVar11 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
            uVar7 = pVar11.first;
            if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              return false;
            }
          }
          this->numsamples_ = uVar7;
          goto LAB_003ba124;
        }
        break;
      case 3:
        if (cVar8 == '\x18') {
          puVar4 = input->buffer_;
          if ((puVar4 < input->buffer_end_) &&
             (uVar7 = (unsigned_long)(char)*puVar4, -1 < (long)uVar7)) {
            input->buffer_ = puVar4 + 1;
          }
          else {
            pVar11 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
            uVar7 = pVar11.first;
            if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              return false;
            }
          }
          this->islogits_ = uVar7 != 0;
          goto LAB_003ba124;
        }
        break;
      case 4:
        if (cVar8 == '%') {
          pfVar3 = (float *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pfVar3 < 4) {
            bVar5 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                              (input,(uint32 *)&local_38);
            if (!bVar5) {
              return false;
            }
            fVar10 = (float)local_38;
          }
          else {
            fVar10 = *pfVar3;
            input->buffer_ = (uint8 *)(pfVar3 + 1);
          }
          this->eps_ = fVar10;
          goto LAB_003ba124;
        }
        break;
      case 5:
        if (cVar8 == '-') {
          pfVar3 = (float *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pfVar3 < 4) {
            bVar5 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                              (input,(uint32 *)((long)&local_38 + 4));
            if (!bVar5) {
              return false;
            }
            fVar10 = local_38._4_4_;
          }
          else {
            fVar10 = *pfVar3;
            input->buffer_ = (uint8 *)(pfVar3 + 1);
          }
          this->temperature_ = fVar10;
          goto LAB_003ba124;
        }
      }
    }
    if (uVar6 == 0) {
      return true;
    }
    if ((uVar6 & 7) == 4) {
      return true;
    }
    bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar6);
    if (!bVar5) {
      return false;
    }
  } while( true );
}

Assistant:

bool CategoricalDistributionLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.CategoricalDistributionLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // int64 seed = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &seed_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int64 numSamples = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &numsamples_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool isLogits = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &islogits_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // float eps = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(37u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &eps_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // float temperature = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(45u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &temperature_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.CategoricalDistributionLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.CategoricalDistributionLayerParams)
  return false;
#undef DO_
}